

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O1

bool __thiscall
tonk::ConnectionMap<unsigned_int,_tonk::UInt32Hasher>::Remove
          (ConnectionMap<unsigned_int,_tonk::UInt32Hasher> *this,uint *key,IConnection *conn)

{
  uint8_t uVar1;
  uint uVar2;
  raw_node *prVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  raw_node *prVar8;
  int iVar9;
  raw_node *prVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  
  uVar2 = (this->TheMap).m_num_valid;
  if (uVar2 != 0) {
    uVar14 = *key;
    uVar5 = uVar14 * -0x61c88647 >> ((byte)(this->TheMap).m_hash_shift & 0x1f);
    uVar7 = (ulong)uVar5;
    prVar3 = (this->TheMap).m_values;
    bVar4 = true;
    if (prVar3[uVar7].m_bits[0x10] != '\0') {
      prVar8 = prVar3 + uVar7;
      if (*(uint *)prVar8->m_bits == uVar14) {
        bVar4 = false;
      }
      else {
        uVar13 = (this->TheMap).m_values_count - 1;
        uVar11 = uVar5;
        do {
          bVar15 = uVar11 == 0;
          prVar8 = prVar8 + -1;
          uVar11 = uVar11 - 1;
          if (bVar15) {
            prVar8 = prVar3 + uVar13;
            uVar11 = uVar13;
          }
          if ((uVar11 == uVar5) || (prVar8->m_bits[0x10] == '\0')) goto LAB_0012167c;
        } while (*(uint *)prVar8->m_bits != uVar14);
        bVar4 = false;
LAB_0012167c:
        uVar7 = (ulong)uVar11;
      }
    }
    if (!bVar4) goto LAB_00121688;
  }
  uVar7 = 0xffffffff;
LAB_00121688:
  if (((int)uVar7 < 0) ||
     (prVar3 = (this->TheMap).m_values, *(IConnection **)(prVar3[uVar7].m_bits + 8) != conn)) {
    bVar4 = false;
  }
  else {
    prVar8 = prVar3 + uVar7;
    prVar8->m_bits[0x10] = '\0';
    (this->TheMap).m_num_valid = uVar2 - 1;
    uVar2 = (this->TheMap).m_hash_shift;
    do {
      uVar12 = (ulong)((this->TheMap).m_values_count - 1);
      iVar6 = (int)uVar7;
      prVar10 = prVar8;
      do {
        do {
          iVar9 = (int)uVar7;
          prVar10 = prVar10 + -1;
          uVar7 = (ulong)(iVar9 - 1);
          if (iVar9 == 0) {
            prVar10 = prVar3 + uVar12;
            uVar7 = uVar12;
          }
          uVar1 = prVar10->m_bits[0x10];
          iVar9 = (int)uVar7;
          if (uVar1 == '\0') goto LAB_00121734;
          uVar14 = (uint)(*(int *)prVar10->m_bits * -0x61c88647) >> (uVar2 & 0x1f);
        } while ((iVar9 <= (int)uVar14) && ((int)uVar14 < iVar6));
      } while ((iVar6 < iVar9) && ((int)uVar14 < iVar6 || iVar9 <= (int)uVar14));
      *(int *)prVar8->m_bits = *(int *)prVar10->m_bits;
      *(undefined8 *)(prVar8->m_bits + 8) = *(undefined8 *)(prVar10->m_bits + 8);
      prVar8->m_bits[0x10] = uVar1;
      prVar10->m_bits[0x10] = '\0';
      prVar8 = prVar10;
LAB_00121734:
    } while (uVar1 != '\0');
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

inline int find_index(const Key& k) const
    {
        if (m_num_valid)
        {
            unsigned index = hash_key(k);
            const node* pNode = get_node(index);

            if (pNode->state)
            {
                if (pNode->first == k) {
                    return index;
                }

                const unsigned orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values_count - 1;
                        pNode = get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (index == orig_index) {
                        break;
                    }

                    if (!pNode->state) {
                        break;
                    }

                    if (pNode->first == k) {
                        return index;
                    }
                }
            }
        }

        return -1; // Not found
    }